

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::computeDual(HModel *this)

{
  HVector *this_00;
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  double __x;
  double dVar10;
  double dVar11;
  
  this_00 = &this->buffer;
  HVector::clear(this_00);
  iVar9 = this->numRow;
  if (0 < iVar9) {
    piVar2 = (this->buffer).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->buffer).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      piVar2[lVar8] = (int)lVar8;
      iVar9 = piVar3[lVar8];
      pdVar6[lVar8] = pdVar4[iVar9] + pdVar5[iVar9];
      lVar8 = lVar8 + 1;
      iVar9 = this->numRow;
    } while (lVar8 < iVar9);
  }
  (this->buffer).count = iVar9;
  HFactor::btran(&this->factor,this_00,1.0);
  HVector::clear(&this->bufferLong);
  HMatrix::price_by_col(&this->matrix,&this->bufferLong,this_00);
  iVar9 = this->numCol;
  lVar8 = (long)iVar9;
  if (lVar8 < 1) {
    __x = 0.0;
  }
  else {
    pdVar4 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->bufferLong).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    __x = 0.0;
    lVar7 = 0;
    do {
      dVar10 = pdVar4[lVar7] - pdVar6[lVar7];
      dVar11 = dVar10 - pdVar5[lVar7];
      __x = __x + dVar11 * dVar11;
      pdVar5[lVar7] = dVar10;
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
  }
  iVar1 = this->numTot;
  if (iVar9 < iVar1) {
    pdVar4 = (this->buffer).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      dVar10 = pdVar5[lVar8 + lVar7] - pdVar4[lVar7];
      dVar11 = dVar10 - pdVar6[lVar8 + lVar7];
      __x = __x + dVar11 * dVar11;
      pdVar6[lVar8 + lVar7] = dVar10;
      lVar7 = lVar7 + 1;
    } while (iVar1 - lVar8 != lVar7);
  }
  if (__x < 0.0) {
    sqrt(__x);
  }
  this->mlFg_haveNonbasicDuals = 1;
  return;
}

Assistant:

void HModel::computeDual() {
  //  printf("computeDual: Entry\n");cout<<flush;
  buffer.clear();
  for (int iRow = 0; iRow < numRow; iRow++) {
    buffer.index[iRow] = iRow;
    buffer.array[iRow] = workCost[basicIndex[iRow]]
      + workShift[basicIndex[iRow]];
  }
  buffer.count = numRow;

  //  printf("computeDual: Before BTRAN\n");cout<<flush;
  factor.btran(buffer, 1);
  //  printf("computeDual: After  BTRAN\n");cout<<flush;

#ifdef JAJH_dev
    int n_rp = 0;
    double rp_tl = 0.0;
    int mx_n_rp = 10;
    double norm_dl_du = 0.0;
#endif
  
    bufferLong.clear();
    matrix.price_by_col(bufferLong, buffer);
    for (int i = 0; i < numCol; i++) {
#ifdef JAJH_dev
      double dl_du = abs(workCost[i] - bufferLong.array[i] - workDual[i]);
      if (dl_du > rp_tl && n_rp < mx_n_rp) {
	rp_tl = dl_du*10;
	n_rp += 1;
	//	printf("computeDual():     DlDu   = %11g for i = %d\n", dl_du, i);
      }
      norm_dl_du += dl_du*dl_du;
#endif
      workDual[i] = workCost[i] - bufferLong.array[i];
    }
    for (int i = numCol; i < numTot; i++) {
#ifdef JAJH_dev
      double dl_du = abs(workCost[i] - buffer.array[i - numCol] - workDual[i]);
      if (dl_du > rp_tl && n_rp < mx_n_rp) {
	rp_tl = dl_du*10;
	n_rp += 1;
	//	printf("computeDual():     DlDu_i = %11g for i = %d\n", dl_du, i);
      }
      norm_dl_du += dl_du*dl_du;
#endif
      workDual[i] = workCost[i] - buffer.array[i - numCol];
    }
#ifdef JAJH_dev
    norm_dl_du = sqrt(norm_dl_du);
    //    printf("computeDual():   ||DlDu|| = %11g\n", norm_dl_du);
#endif
    //Now have a nonbasic duals
    mlFg_haveNonbasicDuals = 1;
}